

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O2

int nn_xsurveyor_add(nn_sockbase *self,nn_pipe *pipe)

{
  undefined8 *data;
  char *pcVar1;
  undefined8 uStack_30;
  int rcvprio;
  size_t sz;
  
  sz = 4;
  nn_pipe_getopt(pipe,0,9,&rcvprio,&sz);
  if (sz == 4) {
    if (0xffffffef < rcvprio - 0x11U) {
      data = (undefined8 *)nn_alloc_(0x40);
      if (data != (undefined8 *)0x0) {
        *data = pipe;
        nn_fq_add((nn_fq *)&self[2].sock,(nn_fq_data *)(data + 4),pipe,rcvprio);
        nn_dist_add((nn_dist *)(self + 1),(nn_dist_data *)(data + 1),pipe);
        nn_pipe_setdata(pipe,data);
        return 0;
      }
      nn_backtrace_print();
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/xsurveyor.c"
              ,0x60);
      goto LAB_0011dac8;
    }
    nn_backtrace_print();
    pcVar1 = "rcvprio >= 1 && rcvprio <= 16";
    uStack_30 = 0x5c;
  }
  else {
    nn_backtrace_print();
    pcVar1 = "sz == sizeof (rcvprio)";
    uStack_30 = 0x5b;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/xsurveyor.c"
          ,uStack_30);
LAB_0011dac8:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_xsurveyor_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xsurveyor *xsurveyor;
    struct nn_xsurveyor_data *data;
    int rcvprio;
    size_t sz;

    xsurveyor = nn_cont (self, struct nn_xsurveyor, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xsurveyor_data),
        "pipe data (xsurveyor)");
    alloc_assert (data);
    data->pipe = pipe;
    nn_fq_add (&xsurveyor->inpipes, &data->initem, pipe, rcvprio);
    nn_dist_add (&xsurveyor->outpipes, &data->outitem, pipe);
    nn_pipe_setdata (pipe, data);

    return 0;
}